

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_accessors_kernels.h
# Opt level: O2

size_t ind_state(Dimensions dims,int nu,int ix,int iy,int iz,int ie,int im,int iu)

{
  uint __line;
  char *__assertion;
  
  if (dims.ncell_x < 1) {
    __assertion = "ix >= 0 && ix < dims.ncell_x";
    __line = 0x4b;
  }
  else if (dims.ncell_y < 1) {
    __assertion = "iy >= 0 && iy < dims.ncell_y";
    __line = 0x4c;
  }
  else if (nu < dims.ncell_z) {
    if (dims.ne < 1) {
      __assertion = "ie >= 0 && ie < dims.ne";
      __line = 0x4e;
    }
    else {
      if (0 < dims.nm) {
        return (ulong)(uint)(nu * dims.ncell_x * dims.nm * dims.ncell_y * dims.ne * 4);
      }
      __assertion = "im >= 0 && im < dims.nm";
      __line = 0x4f;
    }
  }
  else {
    __assertion = "iz >= 0 && iz < dims.ncell_z";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/2_sweeper_base/array_accessors_kernels.h"
                ,__line,
                "size_t ind_state(const Dimensions, const int, const int, const int, const int, const int, const int, const int)"
               );
}

Assistant:

TARGET_HD static inline size_t ind_state(
    const Dimensions dims,
    const int        nu,
    const int        ix,
    const int        iy,
    const int        iz,
    const int        ie,
    const int        im,
    const int        iu )
{
  Assert( nu > 0 );
  Assert( ix >= 0 && ix < dims.ncell_x );
  Assert( iy >= 0 && iy < dims.ncell_y );
  Assert( iz >= 0 && iz < dims.ncell_z );
  Assert( ie >= 0 && ie < dims.ne );
  Assert( im >= 0 && im < dims.nm );
  Assert( iu >= 0 && iu < nu );

  return  im + dims.nm      * (
          iu + nu           * (
          ix + dims.ncell_x * (
          iy + dims.ncell_y * (
          ie + dims.ne      * (
          iz + dims.ncell_z * ( /*---NOTE: This axis MUST be slowest-varying---*/
          0 ))))));
}